

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void number_suite::test_double_minus_one(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1d4;
  long *local_1d0 [2];
  long local_1c0 [2];
  double local_1b0;
  undefined **local_1a8 [5];
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00119b70;
  local_1b0 = -1.0;
  local_1a8[1] = (undefined **)local_180;
  local_1d0[0] = (long *)trial::protocol::json::detail::basic_encoder<char,_24UL>::
                         floating_value<double>((basic_encoder<char,_24UL> *)local_1a8,&local_1b0);
  local_1d4 = 0x11;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(-1.0)","17",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x193,"void number_suite::test_double_minus_one()",local_1d0,&local_1d4);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[18]>
            ("result.str()","\"-1.00000000000000\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x194,"void number_suite::test_double_minus_one()",local_1d0,"-1.00000000000000");
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_double_minus_one()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(-1.0), 17);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "-1.00000000000000");
}